

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ogf_v4.cxx
# Opt level: O2

void __thiscall
xray_re::xr_ogf_v4::bone_motion_io::import(bone_motion_io *this,xr_reader *r,uint_fast32_t num_keys)

{
  byte bVar1;
  byte *pbVar2;
  ogf_key_qr *poVar3;
  _vector3<float> *value;
  _ogf4_key_qt<signed_char> *p_Var4;
  _ogf4_key_qt<short> *p_Var5;
  char *pcVar6;
  short *psVar7;
  size_t i;
  ulong uVar8;
  anon_union_12_2_77b31271_for__vector3<float>_1 local_58;
  fvector3 t_size;
  fvector3 t_init;
  
  xr_bone_motion::create_envelopes((xr_bone_motion *)this);
  pbVar2 = (r->field_2).m_p;
  (r->field_2).m_p = pbVar2 + 1;
  bVar1 = *pbVar2;
  if ((bVar1 & 2) == 0) {
    (r->field_2).m_p = pbVar2 + 5;
    for (uVar8 = 0; num_keys != uVar8; uVar8 = uVar8 + 1) {
      poVar3 = xr_reader::skip<xray_re::ogf_key_qr>(r,1);
      xr_ogf::bone_motion_io::insert_key(&this->super_bone_motion_io,(float)uVar8 / 30.0,poVar3);
    }
  }
  else {
    poVar3 = xr_reader::skip<xray_re::ogf_key_qr>(r,1);
    xr_ogf::bone_motion_io::insert_key(&this->super_bone_motion_io,0.0,poVar3);
  }
  if ((bVar1 & 1) == 0) {
    value = xr_reader::skip<xray_re::_vector3<float>>(r,1);
    xr_ogf::bone_motion_io::insert_key(&this->super_bone_motion_io,0.0,value);
    return;
  }
  (r->field_2).m_p = (r->field_2).m_p + 4;
  if ((bVar1 & 4) == 0) {
    p_Var4 = xr_reader::skip<xray_re::_ogf4_key_qt<signed_char>>(r,num_keys);
    xr_reader::r_fvector3(r,&t_size);
    xr_reader::r_fvector3(r,&t_init);
    pcVar6 = &p_Var4->z;
    for (uVar8 = 0; num_keys != uVar8; uVar8 = uVar8 + 1) {
      local_58._0_8_ =
           CONCAT44((float)(int)pcVar6[-1] * t_size.field_0.field_0.y +
                    (float)((ulong)t_init.field_0._0_8_ >> 0x20),
                    (float)(int)((_ogf4_key_qt<signed_char> *)(pcVar6 + -2))->x *
                    t_size.field_0.field_0.x + (float)t_init.field_0._0_8_);
      local_58.field_0.z = (float)(int)*pcVar6 * t_size.field_0.field_0.z + t_init.field_0.field_0.z
      ;
      xr_ogf::bone_motion_io::insert_key
                (&this->super_bone_motion_io,(float)uVar8 / 30.0,(fvector3 *)&local_58.field_0);
      pcVar6 = pcVar6 + 3;
    }
  }
  else {
    p_Var5 = xr_reader::skip<xray_re::_ogf4_key_qt<short>>(r,num_keys);
    xr_reader::r_fvector3(r,&t_size);
    xr_reader::r_fvector3(r,&t_init);
    psVar7 = &p_Var5->z;
    for (uVar8 = 0; num_keys != uVar8; uVar8 = uVar8 + 1) {
      local_58._0_8_ =
           CONCAT44((float)(int)psVar7[-1] * t_size.field_0.field_0.y +
                    (float)((ulong)t_init.field_0._0_8_ >> 0x20),
                    (float)(int)((_ogf4_key_qt<short> *)(psVar7 + -2))->x * t_size.field_0.field_0.x
                    + (float)t_init.field_0._0_8_);
      local_58.field_0.z = (float)(int)*psVar7 * t_size.field_0.field_0.z + t_init.field_0.field_0.z
      ;
      xr_ogf::bone_motion_io::insert_key
                (&this->super_bone_motion_io,(float)uVar8 / 30.0,(fvector3 *)&local_58.field_0);
      psVar7 = psVar7 + 3;
    }
  }
  return;
}

Assistant:

void xr_ogf_v4::bone_motion_io::import(xr_reader& r, uint_fast32_t num_keys)
{
	create_envelopes();

	unsigned flags = r.r_u8();

	if (flags & KPF_R_ABSENT) {
		insert_key(0, r.skip<ogf_key_qr>());
	} else {
		r.r_u32();
		for (size_t i = 0; i != num_keys; ++i)
			insert_key(i/OGF4_MOTION_FPS, r.skip<ogf_key_qr>());
	}
	if (flags & KPF_T_PRESENT) {
		r.r_u32();
		fvector3 t_init, t_size, value;
		if (flags & KPF_T_HQ) {
			const ogf4_key_qt_hq* keys_qt = r.skip<ogf4_key_qt_hq>(num_keys);
			r.r_fvector3(t_size);
			r.r_fvector3(t_init);
			for (uint_fast32_t i = 0; i != num_keys; ++i) {
				keys_qt[i].dequantize(value, t_size);
				value.add(t_init);
				insert_key(float(i)/OGF4_MOTION_FPS, &value);
			}
		} else {
			const ogf4_key_qt* keys_qt = r.skip<ogf4_key_qt>(num_keys);
			r.r_fvector3(t_size);
			r.r_fvector3(t_init);
			for (uint_fast32_t i = 0; i != num_keys; ++i) {
				keys_qt[i].dequantize(value, t_size);
				value.add(t_init);
				insert_key(float(i)/OGF4_MOTION_FPS, &value);
			}
		}
	} else {
		insert_key(0, r.skip<fvector3>());
	}
}